

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_mul.c
# Opt level: O3

void zzMul(word *c,word *a,size_t n,word *b,size_t m,void *stack)

{
  ulong *puVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  ulong uVar6;
  word wVar7;
  size_t sVar8;
  size_t sVar9;
  word *pwVar10;
  
  wwSetZero(c,m + n);
  if (n != 0) {
    sVar8 = 0;
    pwVar10 = c;
    do {
      if (m == 0) {
        wVar7 = 0;
      }
      else {
        sVar9 = 0;
        wVar7 = 0;
        do {
          auVar5._8_8_ = 0;
          auVar5._0_8_ = wVar7;
          auVar3._8_8_ = 0;
          auVar3._0_8_ = b[sVar9];
          auVar4._8_8_ = 0;
          auVar4._0_8_ = a[sVar8];
          auVar5 = auVar3 * auVar4 + auVar5;
          uVar6 = auVar5._0_8_;
          puVar1 = pwVar10 + sVar9;
          uVar2 = *puVar1;
          *puVar1 = *puVar1 + uVar6;
          wVar7 = auVar5._8_8_ + (ulong)CARRY8(uVar2,uVar6);
          sVar9 = sVar9 + 1;
        } while (m != sVar9);
      }
      c[m + sVar8] = wVar7;
      sVar8 = sVar8 + 1;
      pwVar10 = pwVar10 + 1;
    } while (sVar8 != n);
  }
  return;
}

Assistant:

void zzMul(word c[], const word a[], size_t n, const word b[], size_t m, 
	void* stack)
{
	register word carry = 0;
	register dword prod;
	size_t i, j;
	ASSERT(wwIsDisjoint2(a, n, c, n + m));
	ASSERT(wwIsDisjoint2(b, m, c, n + m));
	wwSetZero(c, n + m);
	for (i = 0; i < n; ++i)
	{
		for (j = 0; j < m; ++j)
		{
			zzMul11(prod, a[i], b[j]);
			prod += carry;
			prod += c[i + j];
			c[i + j] = (word)prod;
			carry = (word)(prod >> B_PER_W);
		}
		c[i + j] = carry;
		carry = 0;
	}
	prod = 0;
}